

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_enemy.cpp
# Opt level: O2

void P_TossItem(AActor *item)

{
  int iVar1;
  
  iVar1 = sv_dropstyle.Value;
  if (sv_dropstyle.Value == 0) {
    iVar1 = gameinfo.defaultdropstyle;
  }
  if (iVar1 == 2) {
    iVar1 = FRandom::Random2(&pr_dropitem,7);
    (item->Vel).X = (double)iVar1 + (item->Vel).X;
    iVar1 = FRandom::Random2(&pr_dropitem,7);
    (item->Vel).Y = (double)iVar1 + (item->Vel).Y;
  }
  else {
    iVar1 = FRandom::Random2(&pr_dropitem);
    (item->Vel).X = (double)iVar1 * 0.00390625 + (item->Vel).X;
    iVar1 = FRandom::Random2(&pr_dropitem);
    (item->Vel).Y = (double)iVar1 * 0.00390625 + (item->Vel).Y;
    iVar1 = FRandom::operator()(&pr_dropitem);
    (item->Vel).Z = (double)iVar1 * 0.015625 + 5.0;
  }
  return;
}

Assistant:

void P_TossItem (AActor *item)
{
	int style = sv_dropstyle;
	if (style==0) style = gameinfo.defaultdropstyle;
	
	if (style==2)
	{
		item->Vel.X += pr_dropitem.Random2(7);
		item->Vel.Y += pr_dropitem.Random2(7);
	}
	else
	{
		item->Vel.X += pr_dropitem.Random2() / 256.;
		item->Vel.Y += pr_dropitem.Random2() / 256.;
		item->Vel.Z = 5. + pr_dropitem() / 64.;
	}
}